

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSingleType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  uint32_t uVar1;
  BasicType id;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  uVar1 = Random::upTo(this->rand,2);
  if (uVar1 == 0) {
    id = generateBasicType(this);
    Type::Type((Type *)&this_local,id);
  }
  else {
    if (uVar1 != 1) {
      wasm::handle_unreachable
                ("unexpected",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0xe8);
    }
    this_local = (HeapTypeGeneratorImpl *)generateRefType(this,share);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type generateSingleType(Shareability share) {
    switch (rand.upTo(2)) {
      case 0:
        return generateBasicType();
      case 1:
        return generateRefType(share);
    }
    WASM_UNREACHABLE("unexpected");
  }